

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SubstitutionTree.hpp
# Opt level: O2

ostream * Indexing::operator<<
                    (ostream *out,
                    SubstitutionTree<Inferences::ALASCA::FourierMotzkinConf::Rhs> *self)

{
  Node *pNVar1;
  
  pNVar1 = self->_root;
  if (pNVar1 == (Node *)0x0) {
    std::operator<<(out,"<empty tree>");
  }
  else {
    (*pNVar1->_vptr_Node[7])(pNVar1,out,0,0);
  }
  return out;
}

Assistant:

std::ostream& operator<<(std::ostream& out, SubstitutionTree<LeafData_> const& self)
  {
#if VERBOSE_OUTPUT_OPERATORS
    out << "{ nextVar: S" << self._nextVar << ", root: (";
#endif // VERBOSE_OUTPUT_OPERATORS
    if (self._root) {
      out << *self._root;
    } else {
      out << "<empty tree>";
    }
#if VERBOSE_OUTPUT_OPERATORS
    out << ") }";
#endif // VERBOSE_OUTPUT_OPERATORS
    return out;
  }